

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_br3p86.c
# Opt level: O0

void br3p86_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double c;
  double b;
  double a;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = get_ext_param(in_RDI,in_RSI,1);
  dVar3 = get_ext_param(in_RDI,in_RSI,2);
  in_RDI->cam_alpha = dVar1;
  *in_RDI->mix_coef = (1.0 - dVar1) - dVar2;
  in_RDI->mix_coef[1] = dVar2;
  in_RDI->mix_coef[2] = 1.0 - dVar3;
  in_RDI->mix_coef[3] = dVar3;
  return;
}

Assistant:

static void
br3p86_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double a, b, c;

  assert(p != NULL);

  a = get_ext_param(p, ext_params, 0);
  b = get_ext_param(p, ext_params, 1);
  c = get_ext_param(p, ext_params, 2);

  p->cam_alpha = a;

  p->mix_coef[0] = 1.0 - a - b;
  p->mix_coef[1] = b;
  p->mix_coef[2] = 1.0 - c;
  p->mix_coef[3] = c;
}